

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

Error * ot::commissioner::internal::DecodeIpv6AddressList
                  (Error *__return_storage_ptr__,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *aAddrs,ByteArray *aBuf)

{
  string *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ErrorCode EVar2;
  pointer puVar3;
  char *pcVar4;
  ulong uVar5;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  ulong uVar6;
  int iVar7;
  format_args args;
  Address addr;
  undefined1 local_b8 [8];
  char *local_b0;
  size_t local_a8;
  char local_a0 [8];
  format_string_checker<char> *local_98;
  parse_func local_90 [1];
  undefined1 local_88 [8];
  uchar *puStack_80;
  pointer local_78;
  uchar local_70 [16];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_60;
  ByteArray *local_58;
  string local_50;
  
  __return_storage_ptr__->mCode = kNone;
  this = &__return_storage_ptr__->mMessage;
  paVar1 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  uVar5 = (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar6 = 0;
  local_60 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)aAddrs;
  local_58 = aBuf;
LAB_0016a16f:
  if (uVar5 <= uVar6) {
    return __return_storage_ptr__;
  }
  if (uVar6 + 0x10 <= uVar5) goto code_r0x0016a185;
  local_b8._0_4_ = none_type;
  local_b0 = "premature end of IPv6 Address";
  local_a8 = 0x1d;
  local_a0 = (char  [8])0x0;
  local_90[0] = (parse_func)0x0;
  begin = "premature end of IPv6 Address";
  local_98 = (format_string_checker<char> *)local_b8;
  do {
    pcVar4 = begin + 1;
    if (*begin == '}') {
      if ((pcVar4 == "") || (*pcVar4 != '}')) {
        ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
      }
      pcVar4 = begin + 2;
    }
    else if (*begin == '{') {
      pcVar4 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (begin,"",(format_string_checker<char> *)local_b8);
    }
    begin = pcVar4;
  } while (pcVar4 != "");
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_b8;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_50,(v10 *)"premature end of IPv6 Address",(string_view)ZEXT816(0x1d),args);
  local_88._0_4_ = 8;
  puStack_80 = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&puStack_80,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  __return_storage_ptr__->mCode = local_88._0_4_;
  std::__cxx11::string::operator=((string *)this,(string *)&puStack_80);
  if (puStack_80 != local_70) {
    operator_delete(puStack_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) {
    return __return_storage_ptr__;
  }
  goto LAB_0016a38e;
code_r0x0016a185:
  local_88 = (undefined1  [8])0x0;
  puStack_80 = (uchar *)0x0;
  local_78 = (pointer)0x0;
  puVar3 = (local_58->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_50,puVar3 + uVar6,
             puVar3 + uVar6 + 0x10,(allocator_type *)local_b8);
  Address::Set((Error *)local_b8,(Address *)local_88,(ByteArray *)&local_50);
  __return_storage_ptr__->mCode = local_b8._0_4_;
  std::__cxx11::string::operator=((string *)this,(string *)&local_b0);
  EVar2 = __return_storage_ptr__->mCode;
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  iVar7 = 6;
  if (EVar2 == kNone) {
    Address::ToString_abi_cxx11_((string *)local_b8,(Address *)local_88);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_b8);
    if ((size_t *)CONCAT44(local_b8._4_4_,local_b8._0_4_) != &local_a8) {
      operator_delete((size_t *)CONCAT44(local_b8._4_4_,local_b8._0_4_));
    }
    iVar7 = 0;
    uVar6 = uVar6 + 0x10;
  }
  if (local_50._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_88 != (undefined1  [8])0x0) {
    operator_delete((void *)local_88);
  }
  if (iVar7 != 0) {
    if ((iVar7 != 6) &&
       (local_50._M_dataplus._M_p = (this->_M_dataplus)._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_50._M_dataplus._M_p != paVar1)) {
LAB_0016a38e:
      operator_delete(local_50._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  goto LAB_0016a16f;
}

Assistant:

Error internal::DecodeIpv6AddressList(std::vector<std::string> &aAddrs, const ByteArray &aBuf)
{
    Error  error;
    size_t length = aBuf.size();
    size_t offset = 0;
    while (offset < length)
    {
        VerifyOrExit(offset + kIpv6AddressBytes <= length, error = ERROR_BAD_FORMAT("premature end of IPv6 Address"));
        Address          addr;
        const ByteArray &value = {aBuf.data() + offset, aBuf.data() + offset + kIpv6AddressBytes};
        SuccessOrExit(error = addr.Set(value));
        aAddrs.emplace_back(addr.ToString());
        offset += kIpv6AddressBytes;
    }

exit:
    return error;
}